

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O2

void __thiscall absl::strings_internal::BigUnsigned<4>::BigUnsigned(BigUnsigned<4> *this,uint64_t v)

{
  uint uVar1;
  
  uVar1 = 2;
  if (v >> 0x20 == 0) {
    uVar1 = (uint)(v != 0);
  }
  this->size_ = uVar1;
  *(uint64_t *)this->words_ = v;
  this->words_[2] = 0;
  this->words_[3] = 0;
  return;
}

Assistant:

explicit constexpr BigUnsigned(uint64_t v)
      : size_((v >> 32) ? 2 : v ? 1 : 0),
        words_{static_cast<uint32_t>(v & 0xffffffffu),
               static_cast<uint32_t>(v >> 32)} {}